

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void duckdb_je_arena_nthreads_dec(arena_t *arena,_Bool internal)

{
  _Bool internal_local;
  arena_t *arena_local;
  
  LOCK();
  arena->nthreads[internal & 1].repr = arena->nthreads[internal & 1].repr - 1;
  UNLOCK();
  return;
}

Assistant:

void
arena_nthreads_dec(arena_t *arena, bool internal) {
	atomic_fetch_sub_u(&arena->nthreads[internal], 1, ATOMIC_RELAXED);
}